

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O1

void helics::valueExtract(data_view *data,DataType baseType,char *val)

{
  undefined8 uVar1;
  double dVar2;
  double *pdVar3;
  string_view val_00;
  char cVar4;
  invalid_argument *this;
  ulong uVar5;
  undefined1 *puVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  string_view val_01;
  long val_1;
  undefined1 local_48 [40];
  __index_type local_20;
  
  if (0x1d < baseType) {
    if (baseType == HELICS_JSON) {
      readJsonValue_abi_cxx11_((defV *)local_48,(helics *)data,(data_view *)val);
      valueExtract((defV *)local_48,val);
LAB_00265537:
      CLI::std::__detail::__variant::
      _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)local_48);
      return;
    }
    if (baseType == HELICS_ANY) {
      local_48[0] = '\0';
      local_48._1_7_ = 0;
      local_20 = '\0';
      valueExtract(data,HELICS_ANY,(defV *)local_48);
      valueExtract((defV *)local_48,val);
      goto LAB_00265537;
    }
    if (baseType == HELICS_MULTI) goto LAB_002656c0;
LAB_00265675:
    local_48[0] = 0;
    local_48._1_7_ = 0;
    local_48._8_8_ = (char *)0x0;
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(string_view *)local_48);
    uVar1 = local_48._8_8_;
    val_00._M_len._1_7_ = local_48._1_7_;
    val_00._M_len._0_1_ = local_48[0];
    val_00._M_str = (char *)local_48._8_8_;
    if (CONCAT71(local_48._1_7_,local_48[0]) != 1) {
      dVar2 = getDoubleFromString(val_00);
      uVar7 = SUB84(dVar2,0);
      uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
      if ((dVar2 != -1e+49) || (NAN(dVar2))) goto LAB_002656ae;
    }
    cVar4 = *(char *)uVar1;
LAB_002656b7:
    *val = cVar4;
    return;
  }
  switch(baseType) {
  case HELICS_DOUBLE:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(double *)local_48);
    cVar4 = (char)(int)(double)CONCAT71(local_48._1_7_,local_48[0]);
    goto LAB_002656b7;
  case HELICS_INT:
  case HELICS_TIME:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(int64_t *)local_48);
    goto LAB_002655e1;
  case HELICS_COMPLEX:
    local_48[0] = 0;
    local_48._1_7_ = 0;
    local_48._8_8_ = 0.0;
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(complex<double> *)local_48);
    uVar7 = (undefined4)CONCAT71(local_48._1_7_,local_48[0]);
    uVar8 = SUB74(local_48._1_7_,3);
    if (((double)local_48._8_8_ != 0.0) || (NAN((double)local_48._8_8_))) {
      dVar2 = cabs((double)CONCAT71(local_48._1_7_,local_48[0]));
      uVar7 = SUB84(dVar2,0);
      uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
    }
LAB_002656ae:
    cVar4 = (char)(int)(double)CONCAT44(uVar8,uVar7);
    goto LAB_002656b7;
  case HELICS_VECTOR:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
              ((vector<double,_std::allocator<double>_> *)local_48,data);
    if (local_48._8_8_ - (long)CONCAT71(local_48._1_7_,local_48[0]) == 8) {
      uVar1 = *(undefined8 *)CONCAT71(local_48._1_7_,local_48[0]);
      uVar7 = (undefined4)uVar1;
      uVar8 = (undefined4)((ulong)uVar1 >> 0x20);
    }
    else {
      dVar2 = vectorNorm((vector<double,_std::allocator<double>_> *)local_48);
      uVar7 = SUB84(dVar2,0);
      uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    break;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_48,data)
    ;
    pdVar3 = (double *)CONCAT71(local_48._1_7_,local_48[0]);
    if (local_48._8_8_ - (long)pdVar3 == 0x10) {
      dVar2 = *pdVar3;
      uVar7 = SUB84(dVar2,0);
      uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
      if ((pdVar3[1] != 0.0) || (NAN(pdVar3[1]))) {
        dVar2 = cabs(dVar2);
        uVar7 = SUB84(dVar2,0);
        uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
      }
    }
    else {
      dVar2 = vectorNorm((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                         local_48);
      uVar7 = SUB84(dVar2,0);
      uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    break;
  case HELICS_NAMED_POINT:
    ValueConverter<helics::NamedPoint>::interpret((NamedPoint *)local_48,data);
    uVar7 = (undefined4)local_48._32_8_;
    uVar8 = SUB84(local_48._32_8_,4);
    if (NAN((double)local_48._32_8_)) {
      if (local_48._8_8_ == 1) {
        cVar4 = *(char *)CONCAT71(local_48._1_7_,local_48[0]);
      }
      else {
        val_01._M_str = (char *)CONCAT71(local_48._1_7_,local_48[0]);
        val_01._M_len = local_48._8_8_;
        dVar2 = getDoubleFromString(val_01);
        uVar7 = SUB84(dVar2,0);
        uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
        if ((dVar2 != -1e+49) || (NAN(dVar2))) goto LAB_0026564b;
        cVar4 = *(char *)CONCAT71(local_48._1_7_,local_48[0]);
      }
    }
    else {
LAB_0026564b:
      cVar4 = (char)(int)(double)CONCAT44(uVar8,uVar7);
    }
    *val = cVar4;
    puVar6 = (undefined1 *)CONCAT71(local_48._1_7_,local_48[0]);
    if (puVar6 == local_48 + 0x10) {
      return;
    }
    uVar5 = local_48._16_8_ + 1;
    goto LAB_0026571b;
  case HELICS_BOOL:
    local_48[0] = 0;
    local_48._1_7_ = 0;
    local_48._8_8_ = (char *)0x0;
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(string_view *)local_48);
    local_48[0] = *(undefined1 *)local_48._8_8_;
LAB_002655e1:
    *val = local_48[0];
    return;
  default:
    if (baseType == HELICS_CUSTOM) {
LAB_002656c0:
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"unrecognized helics type");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    goto LAB_00265675;
  }
  *val = (char)(int)(double)CONCAT44(uVar8,uVar7);
  puVar6 = (undefined1 *)CONCAT71(local_48._1_7_,local_48[0]);
  if (puVar6 == (undefined1 *)0x0) {
    return;
  }
  uVar5 = local_48._16_8_ - (long)puVar6;
LAB_0026571b:
  operator_delete(puVar6,uVar5);
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, char& val)
{
    switch (baseType) {
        case DataType::HELICS_ANY: {
            defV val_dv;
            valueExtract(data, baseType, val_dv);
            valueExtract(val_dv, val);
            break;
        }
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            auto value = ValueConverter<std::string_view>::interpret(data);
            if (value.size() == 1) {
                val = value[0];
            } else {
                const double dval = getDoubleFromString(value);
                if (dval != invalidDouble) {
                    val = static_cast<char>(dval);
                } else {
                    val = value[0];
                }
            }
        }

        break;
        case DataType::HELICS_BOOL:
            val = ValueConverter<std::string_view>::interpret(data)[0];
            break;
        case DataType::HELICS_NAMED_POINT: {
            auto npval = ValueConverter<NamedPoint>::interpret(data);
            if (std::isnan(npval.value)) {
                if (npval.name.size() == 1) {
                    val = npval.name[0];
                } else {
                    const double value = getDoubleFromString(npval.name);
                    if (value != invalidDouble) {
                        val = static_cast<char>(value);
                    } else {
                        val = npval.name[0];
                    }
                }
            } else {
                val = static_cast<char>(npval.value);
            }
            break;
        }
        case DataType::HELICS_DOUBLE: {
            val = static_cast<char>(ValueConverter<double>::interpret(data));
            break;
        }
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME: {
            auto intVal = ValueConverter<int64_t>::interpret(data);
            val = static_cast<char>(intVal);
            break;
        }

        case DataType::HELICS_VECTOR: {
            auto vec = ValueConverter<std::vector<double>>::interpret(data);
            val = static_cast<char>((vec.size() == 1) ? vec[0] : vectorNorm(vec));
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto cval = ValueConverter<std::complex<double>>::interpret(data);
            val = static_cast<char>((cval.imag() == 0.0) ? cval.real() : std::abs(cval));
            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto cvec = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            val = static_cast<char>(
                (cvec.size() == 1) ?
                    ((cvec[0].imag() == 0.0) ? cvec[0].real() : std::abs(cvec[0])) :
                    vectorNorm(cvec));
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
        case DataType::HELICS_CUSTOM:
        case DataType::HELICS_MULTI:
            throw(std::invalid_argument("unrecognized helics type"));
    }
}